

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PolymorphicInlineCacheInfo * __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::GetInlineeInfo
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *inlineeFunctionBody)

{
  PolymorphicInlineCacheInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SListNodeBase<Memory::Recycler> **ppSVar5;
  WriteBarrierPtr *this_00;
  PolymorphicInlineCacheInfo **ppPVar6;
  FunctionBody *pFVar7;
  PolymorphicInlineCacheInfo *info;
  Iterator iter;
  FunctionBody *inlineeFunctionBody_local;
  EntryPointPolymorphicInlineCacheInfo *this_local;
  SListNodeBase<Memory::Recycler> local_28;
  SListNodeBase<Memory::Recycler> local_20;
  PolymorphicInlineCacheInfo **local_18;
  bool local_9;
  
  iter.current = (NodeBase *)inlineeFunctionBody;
  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator::Iterator
            ((Iterator *)&info,
             (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
             &this->inlineeInfo);
  while( true ) {
    local_18 = &info;
    if (iter.list == (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pPVar1 = info;
    SListNodeBase<Memory::Recycler>::Next(&local_20);
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                        ((WriteBarrierPtr *)&local_20);
    bVar3 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::IsHead
                      ((SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                       pPVar1,*ppSVar5);
    if (bVar3) {
      iter.list = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)0x0;
    }
    else {
      SListNodeBase<Memory::Recycler>::Next(&local_28);
      ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                          ((WriteBarrierPtr *)&local_28);
      iter.list = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                  *ppSVar5;
    }
    local_9 = !bVar3;
    if (!local_9) break;
    this_00 = (WriteBarrierPtr *)
              SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator::
              Data((Iterator *)&info);
    ppPVar6 = Memory::WriteBarrierPtr::operator_cast_to_PolymorphicInlineCacheInfo__(this_00);
    pPVar1 = *ppPVar6;
    pFVar7 = PolymorphicInlineCacheInfo::GetFunctionBody(pPVar1);
    if (pFVar7 == (FunctionBody *)iter.current) {
      return pPVar1;
    }
  }
  return (PolymorphicInlineCacheInfo *)0x0;
}

Assistant:

PolymorphicInlineCacheInfo * EntryPointPolymorphicInlineCacheInfo::GetInlineeInfo(FunctionBody * inlineeFunctionBody)
    {
        SListCounted<PolymorphicInlineCacheInfo*, Recycler>::Iterator iter(&inlineeInfo);
        while (iter.Next())
        {
            PolymorphicInlineCacheInfo * info = iter.Data();
            if (info->GetFunctionBody() == inlineeFunctionBody)
            {
                return info;
            }
        }

        return nullptr;
    }